

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_buffer.h
# Opt level: O2

Span<char> __thiscall absl::lts_20240722::CordBuffer::Rep::long_available(Rep *this)

{
  CordRepFlat *this_00;
  size_t sVar1;
  size_t sVar2;
  Span<char> SVar3;
  
  if (((this->field_0).short_rep.raw_size & 1U) == 0) {
    this_00 = (this->field_0).long_rep.rep;
    sVar1 = (this_00->super_CordRep).length;
    sVar2 = cord_internal::CordRepFlat::Capacity(this_00);
    SVar3.len_ = sVar2 - sVar1;
    SVar3.ptr_ = (pointer)((this_00->super_CordRep).storage + sVar1);
    return SVar3;
  }
  __assert_fail("!is_short()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/cord_buffer.h"
                ,0x153,"absl::Span<char> absl::CordBuffer::Rep::long_available() const");
}

Assistant:

bool is_short() const {
      constexpr size_t offset = offsetof(Short, raw_size);
      return (reinterpret_cast<const char*>(this)[offset] & 1) != 0;
    }